

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O0

bool __thiscall Parse::SMTLIB2::parseAsBuiltinTermSymbol(SMTLIB2 *this,string *id,LExpr *exp)

{
  bool bVar1;
  byte bVar2;
  void *pvVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  TermList trm;
  long in_RDI;
  TermList innerSort;
  TermList indexSort;
  TermList another;
  TermList res_8;
  TermList second;
  uint fun_6;
  Interpretation intp;
  TermList res_9;
  uint fun_7;
  Interpretation intp_1;
  TermList sort_1;
  TermList first;
  TermList res_7;
  uint fun_5;
  TermList int2;
  TermList int1;
  TermList res_6;
  uint fun_4;
  TermList theInt_1;
  TermList res_5;
  TermList args [3];
  uint fun_3;
  OperatorType *funType_1;
  TermList theValue;
  TermList theIndex_1;
  TermList arraySortIdx_1;
  TermList theArray_1;
  TermList res_4;
  uint fun_2;
  OperatorType *funType;
  Formula *res_3;
  uint pred;
  OperatorType *predType;
  TermList theIndex;
  TermList arraySortIdx;
  TermList theArray;
  TermList res_2;
  uint fun_1;
  TermList theReal;
  TermList res_1;
  uint fun;
  TermList theInt;
  TermList res;
  TermList elseBranch;
  TermList sort;
  TermList thenBranch;
  Formula *cond;
  TermSymbol ts;
  TermList in_stack_ffffffffffffecd8;
  Signature *in_stack_ffffffffffffece0;
  TermList in_stack_ffffffffffffece8;
  TermList in_stack_ffffffffffffecf0;
  TermList sort_00;
  TermList in_stack_ffffffffffffecf8;
  TermList in_stack_ffffffffffffed00;
  TermList in_stack_ffffffffffffed08;
  TermList in_stack_ffffffffffffed10;
  undefined6 in_stack_ffffffffffffed18;
  undefined1 in_stack_ffffffffffffed1e;
  undefined1 in_stack_ffffffffffffed1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed20;
  undefined8 in_stack_ffffffffffffed70;
  Interpretation i;
  TermList in_stack_ffffffffffffed78;
  TermList *in_stack_ffffffffffffed90;
  uint in_stack_ffffffffffffed98;
  uint in_stack_ffffffffffffed9c;
  uint uVar4;
  byte local_1241;
  SMTLIB2 *in_stack_ffffffffffffedf0;
  TermList in_stack_ffffffffffffedf8;
  LExpr *in_stack_ffffffffffffee20;
  LExpr *exp_00;
  string *in_stack_ffffffffffffee28;
  string *symbolClass;
  SMTLIB2 *in_stack_ffffffffffffee30;
  OperatorType *in_stack_ffffffffffffee58;
  undefined8 in_stack_ffffffffffffee60;
  Interpretation interp;
  undefined7 in_stack_ffffffffffffee68;
  undefined1 in_stack_ffffffffffffee6f;
  TermSymbol in_stack_ffffffffffffee7c;
  SMTLIB2 *in_stack_ffffffffffffee80;
  TermList in_stack_ffffffffffffee88;
  bool local_1161;
  bool local_111d;
  bool local_10d1;
  bool local_1099;
  bool local_ff1;
  bool local_f79;
  bool local_f31;
  bool local_ef1;
  byte local_ea9;
  ParseResult local_e88;
  uint64_t local_e50;
  uint64_t local_e48;
  undefined1 local_e40 [56];
  uint64_t local_e08;
  uint64_t local_e00;
  uint64_t local_dc0;
  uint64_t local_db8;
  uint64_t local_db0;
  uint64_t local_da8;
  TermList local_d68 [8];
  TermList local_d28 [6];
  TermList local_cf8;
  TermList local_cf0 [8];
  TermList local_cb0 [6];
  TermList local_c80;
  undefined8 local_c78;
  uint64_t local_c70;
  uint64_t local_c30;
  undefined8 local_c28;
  undefined8 local_c20;
  TermList local_bb8;
  TermList local_bb0;
  uint64_t local_ba8;
  uint64_t local_ba0;
  undefined8 local_b98;
  TermList local_b30;
  TermList local_b28;
  uint local_b1c;
  uint64_t local_b18;
  Interpretation local_b10;
  undefined8 local_ae8;
  uint64_t local_ae0;
  uint64_t local_aa0;
  undefined8 local_a98;
  uint local_a8c;
  uint64_t local_a88;
  Interpretation local_a7c;
  TermList local_a40;
  string local_a31;
  TermList local_a10;
  undefined8 local_a08;
  uint64_t local_a00;
  uint64_t local_9c0;
  uint64_t local_9b8;
  undefined8 local_9b0;
  uint local_9a8;
  TermList local_980;
  byte local_971;
  TermList local_938;
  TermList local_930;
  byte local_921;
  TermList local_8e8;
  TermList local_8e0;
  TermList local_8d8;
  undefined8 local_8d0;
  uint64_t local_8c8;
  uint64_t local_888;
  undefined8 local_880;
  uint local_878;
  TermList local_850;
  byte local_841;
  TermList local_808;
  TermList local_800;
  undefined8 local_7f8;
  uint64_t local_7f0;
  undefined8 local_7b0;
  uint64_t local_7a8;
  uint64_t local_7a0;
  uint64_t local_798;
  uint local_784;
  uint64_t local_780;
  OperatorType *local_778;
  uint64_t local_748;
  TermList local_740;
  byte local_731;
  TermList local_6f8;
  TermList local_6f0 [6];
  uint64_t local_6c0;
  TermList local_6b8;
  byte local_6a9;
  TermList local_670;
  TermList local_668 [13];
  uint64_t local_600;
  TermList local_5d0;
  undefined8 local_5c8;
  uint64_t local_5c0;
  uint64_t local_5b8;
  uint64_t local_578;
  uint64_t local_570;
  undefined8 local_568;
  uint local_55c;
  uint64_t local_558;
  OperatorType *local_550;
  uint64_t local_510;
  uint64_t local_508;
  void *local_500;
  uint local_4f4;
  uint64_t local_4f0;
  OperatorType *local_4e8;
  TermList local_4e0;
  uint64_t local_4d8;
  TermList local_4d0 [6];
  uint64_t local_4a0;
  TermList local_498;
  byte local_489;
  TermList local_450;
  TermList local_448 [13];
  uint64_t local_3e0;
  TermList local_3b0;
  undefined8 local_3a8;
  uint64_t local_3a0;
  uint64_t local_360;
  undefined8 local_358;
  uint local_350;
  TermList local_328;
  byte local_319;
  TermList local_2e0;
  TermList local_2d8;
  undefined8 local_2d0;
  uint64_t local_2c8;
  uint64_t local_288;
  undefined8 local_280;
  uint local_278;
  TermList local_250;
  byte local_241;
  TermList local_208;
  TermList local_200;
  undefined8 local_1f8;
  uint64_t local_1f0;
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  undefined8 local_198;
  byte local_161;
  TermList local_128;
  TermList local_120 [8];
  TermList local_e0 [6];
  TermList local_b0 [7];
  ulong local_78;
  byte local_69;
  TermSymbol local_24;
  bool local_1;
  
  interp = (Interpretation)((ulong)in_stack_ffffffffffffee60 >> 0x20);
  i = (Interpretation)((ulong)in_stack_ffffffffffffed70 >> 0x20);
  local_24 = getBuiltInTermSymbol((string *)in_stack_ffffffffffffece8._content);
  switch(local_24) {
  case TS_MULTIPLY:
  case TS_PLUS:
  case TS_MINUS:
  case TS_DIVIDE:
  case TS_DIV:
    Kernel::TermList::TermList(&local_a10);
    bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
    if (!bVar1) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                  ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
        local_a40 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                        (TermList *)in_stack_ffffffffffffece0);
        ParseResult::~ParseResult((ParseResult *)0xa65b69);
        bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                          ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
        if (!bVar1) {
          Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                    ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
          bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
          if (!bVar1) {
            local_b18 = local_a40._content;
            local_b10 = getTermSymbolInterpretation
                                  (in_stack_ffffffffffffee80,in_stack_ffffffffffffee7c,
                                   in_stack_ffffffffffffee88);
            local_b1c = Kernel::Signature::getInterpretingSymbol
                                  (in_stack_ffffffffffffece0,
                                   (Interpretation)(in_stack_ffffffffffffecd8._content >> 0x20));
            Kernel::TermList::TermList(&local_b28);
            Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                      ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
            local_b30 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                            (TermList *)in_stack_ffffffffffffece0);
            bVar1 = Kernel::TermList::operator!=(&local_b30,&local_a40);
            ParseResult::~ParseResult((ParseResult *)0xa65e99);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_ffffffffffffed20,
                         (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                          CONCAT16(in_stack_ffffffffffffed1e,
                                                   in_stack_ffffffffffffed18)),
                         (allocator<char> *)in_stack_ffffffffffffed10._content);
              complainAboutArgShortageOrWrongSorts
                        (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,
                         in_stack_ffffffffffffee20);
            }
            local_ba0 = local_a10._content;
            local_ba8 = local_b28._content;
            Kernel::Term::create2
                      ((uint)(in_stack_ffffffffffffecf0._content >> 0x20),in_stack_ffffffffffffed00,
                       in_stack_ffffffffffffecf8);
            Kernel::TermList::TermList
                      ((TermList *)in_stack_ffffffffffffece0,
                       (Term *)in_stack_ffffffffffffecd8._content);
            while( true ) {
              bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isNonEmpty
                                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
              local_1241 = 0;
              if (bVar1) {
                Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                          ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
                bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
                local_1241 = bVar1 ^ 0xff;
              }
              if ((local_1241 & 1) == 0) break;
              Kernel::TermList::TermList(&local_bb0);
              Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                        ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
              local_bb8 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                              (TermList *)in_stack_ffffffffffffece0);
              bVar1 = Kernel::TermList::operator!=(&local_bb8,&local_a40);
              uVar4 = (uint)bVar1 << 0x18;
              ParseResult::~ParseResult((ParseResult *)0xa660b4);
              if ((uVar4 & 0x1000000) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_ffffffffffffed20,
                           (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                            CONCAT16(in_stack_ffffffffffffed1e,
                                                     in_stack_ffffffffffffed18)),
                           (allocator<char> *)in_stack_ffffffffffffed10._content);
                complainAboutArgShortageOrWrongSorts
                          (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,
                           in_stack_ffffffffffffee20);
              }
              local_c28 = local_b98;
              local_c30 = local_bb0._content;
              Kernel::Term::create2
                        ((uint)(in_stack_ffffffffffffecf0._content >> 0x20),
                         in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
              Kernel::TermList::TermList
                        ((TermList *)in_stack_ffffffffffffece0,
                         (Term *)in_stack_ffffffffffffecd8._content);
              local_b98 = local_c20;
            }
            local_c70 = local_a40._content;
            local_c78 = local_b98;
            ParseResult::ParseResult
                      ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
                       in_stack_ffffffffffffece8);
            Lib::Stack<Parse::SMTLIB2::ParseResult>::push
                      ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
                       (ParseResult *)in_stack_ffffffffffffece8._content);
            ParseResult::~ParseResult((ParseResult *)0xa66275);
            return true;
          }
        }
        if (local_24 == TS_MINUS) {
          local_a88 = local_a40._content;
          local_a7c = getUnaryMinusInterpretation
                                (in_stack_ffffffffffffedf0,in_stack_ffffffffffffedf8);
          local_a8c = Kernel::Signature::getInterpretingSymbol
                                (in_stack_ffffffffffffece0,
                                 (Interpretation)(in_stack_ffffffffffffecd8._content >> 0x20));
          local_aa0 = local_a10._content;
          Kernel::Term::create1
                    ((uint)(in_stack_ffffffffffffece8._content >> 0x20),in_stack_ffffffffffffecf0);
          Kernel::TermList::TermList
                    ((TermList *)in_stack_ffffffffffffece0,
                     (Term *)in_stack_ffffffffffffecd8._content);
          local_ae0 = local_a40._content;
          local_ae8 = local_a98;
          ParseResult::ParseResult
                    ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
                     in_stack_ffffffffffffece8);
          Lib::Stack<Parse::SMTLIB2::ParseResult>::push
                    ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
                     (ParseResult *)in_stack_ffffffffffffece8._content);
          ParseResult::~ParseResult((ParseResult *)0xa65cb1);
          return true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed20,
                   (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                    CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                   (allocator<char> *)in_stack_ffffffffffffed10._content);
        complainAboutArgShortageOrWrongSorts
                  (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
      }
    }
    symbolClass = &local_a31;
    exp_00 = (LExpr *)BUILT_IN_SYMBOL;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffed20,
               (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
               (allocator<char> *)in_stack_ffffffffffffed10._content);
    complainAboutArgShortageOrWrongSorts(in_stack_ffffffffffffee30,symbolClass,exp_00);
  case TS_ARRAY:
    Kernel::TermList::TermList(&local_c80);
    bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
    if (!bVar1) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                  ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
        local_cb0[0] = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                           (TermList *)in_stack_ffffffffffffece0);
        local_cf0[0] = Kernel::AtomicSort::superSort();
        bVar1 = Kernel::TermList::operator==(local_cb0,local_cf0);
        ParseResult::~ParseResult((ParseResult *)0xa6643b);
        local_78 = CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar1) ^ 0xff;
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          ParseResult::~ParseResult((ParseResult *)0xa66466);
LAB_00a668d7:
          _Unwind_Resume(local_78);
        }
        Kernel::TermList::TermList(&local_cf8);
        bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                          ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
        if (!bVar1) {
          Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                    ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
          bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
          if (!bVar1) {
            Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                      ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
            local_d28[0] = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                               (TermList *)in_stack_ffffffffffffece0);
            local_d68[0] = Kernel::AtomicSort::superSort();
            bVar1 = Kernel::TermList::operator==(local_d28,local_d68);
            bVar2 = bVar1 ^ 0xff;
            ParseResult::~ParseResult((ParseResult *)0xa665e6);
            local_78 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),bVar2);
            if ((bVar2 & 1) == 0) {
              local_da8 = (uint64_t)Kernel::AtomicSort::superSort();
              local_db8 = local_c80._content;
              local_dc0 = local_cf8._content;
              local_db0 = (uint64_t)
                          Kernel::AtomicSort::arraySort
                                    (in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
              ParseResult::ParseResult
                        ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
                         in_stack_ffffffffffffece8);
              Lib::Stack<Parse::SMTLIB2::ParseResult>::push
                        ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
                         (ParseResult *)in_stack_ffffffffffffece8._content);
              ParseResult::~ParseResult((ParseResult *)0xa666b3);
              return true;
            }
            ParseResult::~ParseResult((ParseResult *)0xa66611);
            goto LAB_00a668d7;
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed20,
                   (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                    CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                   (allocator<char> *)in_stack_ffffffffffffed10._content);
        complainAboutArgShortageOrWrongSorts
                  (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffed20,
               (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
               (allocator<char> *)in_stack_ffffffffffffed10._content);
    complainAboutArgShortageOrWrongSorts
              (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
  case TS_BOOL:
    local_e00 = (uint64_t)Kernel::AtomicSort::superSort();
    local_e08 = (uint64_t)Kernel::AtomicSort::boolSort();
    ParseResult::ParseResult
              ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
               in_stack_ffffffffffffece8);
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push
              ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
               (ParseResult *)in_stack_ffffffffffffece8._content);
    ParseResult::~ParseResult((ParseResult *)0xa66753);
    local_1 = true;
    break;
  case TS_INT:
    trm._content = in_RDI + 200;
    local_e48 = (uint64_t)Kernel::AtomicSort::superSort();
    local_e50 = (uint64_t)Kernel::AtomicSort::intSort();
    sort_00._content = (uint64_t)local_e40;
    ParseResult::ParseResult((ParseResult *)in_stack_ffffffffffffece0,sort_00,trm);
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push
              ((Stack<Parse::SMTLIB2::ParseResult> *)sort_00._content,(ParseResult *)trm._content);
    ParseResult::~ParseResult((ParseResult *)0xa667f3);
    local_1 = true;
    break;
  case TS_REAL:
    Kernel::AtomicSort::superSort();
    Kernel::AtomicSort::realSort();
    ParseResult::ParseResult(&local_e88,in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8);
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push
              ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
               (ParseResult *)in_stack_ffffffffffffece8._content);
    ParseResult::~ParseResult((ParseResult *)0xa66891);
    local_1 = true;
    break;
  case TS_ABS:
    Kernel::TermList::TermList(&local_800);
    bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
    local_841 = 0;
    local_111d = true;
    if (!bVar1) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
      local_111d = true;
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                  ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
        local_841 = 1;
        local_808 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                        (TermList *)in_stack_ffffffffffffece0);
        local_850 = Kernel::AtomicSort::intSort();
        local_111d = Kernel::TermList::operator!=(&local_808,&local_850);
      }
    }
    if ((local_841 & 1) != 0) {
      ParseResult::~ParseResult((ParseResult *)0xa65355);
    }
    if (local_111d != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed20,
                 (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                  CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                 (allocator<char> *)in_stack_ffffffffffffed10._content);
      complainAboutArgShortageOrWrongSorts
                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
    }
    local_878 = Kernel::Signature::getInterpretingSymbol
                          (in_stack_ffffffffffffece0,
                           (Interpretation)(in_stack_ffffffffffffecd8._content >> 0x20));
    local_888 = local_800._content;
    Kernel::Term::create1
              ((uint)(in_stack_ffffffffffffece8._content >> 0x20),in_stack_ffffffffffffecf0);
    Kernel::TermList::TermList
              ((TermList *)in_stack_ffffffffffffece0,(Term *)in_stack_ffffffffffffecd8._content);
    local_8c8 = (uint64_t)Kernel::AtomicSort::intSort();
    local_8d0 = local_880;
    ParseResult::ParseResult
              ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
               in_stack_ffffffffffffece8);
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push
              ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
               (ParseResult *)in_stack_ffffffffffffece8._content);
    ParseResult::~ParseResult((ParseResult *)0xa6550e);
    local_1 = true;
    break;
  case TS_ITE:
    bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
    local_69 = 0;
    local_ea9 = 1;
    if (!bVar1) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
      local_ea9 = 1;
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                  ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
        local_69 = 1;
        bVar1 = ParseResult::asFormula
                          ((ParseResult *)
                           CONCAT17(in_stack_ffffffffffffed1f,
                                    CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                           (Formula **)in_stack_ffffffffffffed10._content);
        local_ea9 = bVar1 ^ 0xff;
      }
    }
    if ((local_69 & 1) != 0) {
      ParseResult::~ParseResult((ParseResult *)0xa63661);
    }
    if ((local_ea9 & 1) == 0) {
      Kernel::TermList::TermList(local_b0);
      bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                        ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                  ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
        bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
        if (!bVar1) {
          Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                    ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
          local_e0[0] = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                            (TermList *)in_stack_ffffffffffffece0);
          ParseResult::~ParseResult((ParseResult *)0xa638a3);
          Kernel::TermList::TermList(local_120);
          bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                            ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
          local_161 = 0;
          local_ef1 = true;
          if (!bVar1) {
            Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
            bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
            local_ef1 = true;
            if (!bVar1) {
              Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                        ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
              local_161 = 1;
              local_128 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                              (TermList *)in_stack_ffffffffffffece0);
              local_ef1 = Kernel::TermList::operator!=(&local_128,local_e0);
            }
          }
          if ((local_161 & 1) != 0) {
            ParseResult::~ParseResult((ParseResult *)0xa639c0);
          }
          if (local_ef1 == false) {
            local_1a0 = local_b0[0]._content;
            local_1a8 = local_120[0]._content;
            local_1b0 = local_e0[0]._content;
            Kernel::Term::createITE
                      ((Formula *)in_stack_ffffffffffffecf8._content,in_stack_ffffffffffffed10,
                       in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
            Kernel::TermList::TermList
                      ((TermList *)in_stack_ffffffffffffece0,
                       (Term *)in_stack_ffffffffffffecd8._content);
            local_1f0 = local_e0[0]._content;
            local_1f8 = local_198;
            ParseResult::ParseResult
                      ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
                       in_stack_ffffffffffffece8);
            Lib::Stack<Parse::SMTLIB2::ParseResult>::push
                      ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
                       (ParseResult *)in_stack_ffffffffffffece8._content);
            ParseResult::~ParseResult((ParseResult *)0xa63bb7);
            return true;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed20,
                     (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                      CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18))
                     ,(allocator<char> *)in_stack_ffffffffffffed10._content);
          complainAboutArgShortageOrWrongSorts
                    (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed20,
                 (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                  CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                 (allocator<char> *)in_stack_ffffffffffffed10._content);
      complainAboutArgShortageOrWrongSorts
                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffed20,
               (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
               (allocator<char> *)in_stack_ffffffffffffed10._content);
    complainAboutArgShortageOrWrongSorts
              (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
  default:
    local_1 = false;
    break;
  case TS_MOD:
    Kernel::TermList::TermList(&local_8d8);
    Kernel::TermList::TermList(&local_8e0);
    bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
    local_921 = 0;
    local_971 = 0;
    local_1161 = true;
    if (!bVar1) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
      local_1161 = true;
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                  ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
        local_921 = 1;
        local_8e8 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                        (TermList *)in_stack_ffffffffffffece0);
        local_930 = Kernel::AtomicSort::intSort();
        bVar1 = Kernel::TermList::operator!=(&local_8e8,&local_930);
        local_1161 = true;
        if (!bVar1) {
          bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                            ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
          local_1161 = true;
          if (!bVar1) {
            Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
            bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
            local_1161 = true;
            if (!bVar1) {
              Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                        ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
              local_971 = 1;
              local_938 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                              (TermList *)in_stack_ffffffffffffece0);
              local_980 = Kernel::AtomicSort::intSort();
              local_1161 = Kernel::TermList::operator!=(&local_938,&local_980);
            }
          }
        }
      }
    }
    if ((local_971 & 1) != 0) {
      ParseResult::~ParseResult((ParseResult *)0xa657c6);
    }
    if ((local_921 & 1) != 0) {
      ParseResult::~ParseResult((ParseResult *)0xa657df);
    }
    if (local_1161 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed20,
                 (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                  CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                 (allocator<char> *)in_stack_ffffffffffffed10._content);
      complainAboutArgShortageOrWrongSorts
                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
    }
    local_9a8 = Kernel::Signature::getInterpretingSymbol
                          (in_stack_ffffffffffffece0,
                           (Interpretation)(in_stack_ffffffffffffecd8._content >> 0x20));
    local_9b8 = local_8d8._content;
    local_9c0 = local_8e0._content;
    Kernel::Term::create2
              ((uint)(in_stack_ffffffffffffecf0._content >> 0x20),in_stack_ffffffffffffed00,
               in_stack_ffffffffffffecf8);
    Kernel::TermList::TermList
              ((TermList *)in_stack_ffffffffffffece0,(Term *)in_stack_ffffffffffffecd8._content);
    local_a00 = (uint64_t)Kernel::AtomicSort::intSort();
    local_a08 = local_9b0;
    ParseResult::ParseResult
              ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
               in_stack_ffffffffffffece8);
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push
              ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
               (ParseResult *)in_stack_ffffffffffffece8._content);
    ParseResult::~ParseResult((ParseResult *)0xa659e1);
    local_1 = true;
    break;
  case TS_SELECT:
    Kernel::TermList::TermList(&local_3b0);
    bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
    if (!bVar1) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                  ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
        local_3e0 = (uint64_t)
                    ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                        (TermList *)in_stack_ffffffffffffece0);
        ParseResult::~ParseResult((ParseResult *)0xa6438f);
        bVar1 = Kernel::TermList::isArraySort((TermList *)in_stack_ffffffffffffece0);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed20,
                     (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                      CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18))
                     ,(allocator<char> *)in_stack_ffffffffffffed10._content);
          complainAboutArgShortageOrWrongSorts
                    (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
        }
        Kernel::TermList::TermList(local_448);
        bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                          ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
        local_489 = 0;
        local_ff1 = true;
        if (!bVar1) {
          Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                    ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
          bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
          local_ff1 = true;
          if (!bVar1) {
            Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                      ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
            local_489 = 1;
            local_450 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                            (TermList *)in_stack_ffffffffffffece0);
            local_4a0 = local_3e0;
            local_498 = Kernel::SortHelper::getIndexSort(in_stack_ffffffffffffecd8);
            local_ff1 = Kernel::TermList::operator!=(&local_450,&local_498);
          }
        }
        if ((local_489 & 1) != 0) {
          ParseResult::~ParseResult((ParseResult *)0xa645c9);
        }
        if (local_ff1 == false) {
          local_4d8 = local_3e0;
          local_4d0[0] = Kernel::SortHelper::getInnerSort(in_stack_ffffffffffffecd8);
          local_4e0 = Kernel::AtomicSort::boolSort();
          bVar1 = Kernel::TermList::operator==(local_4d0,&local_4e0);
          if (bVar1) {
            local_4f0 = local_3e0;
            local_4e8 = Kernel::Theory::getArrayOperatorType(in_stack_ffffffffffffed78,i);
            local_4f4 = Kernel::Signature::getInterpretingSymbol
                                  ((Signature *)
                                   CONCAT17(in_stack_ffffffffffffee6f,in_stack_ffffffffffffee68),
                                   interp,in_stack_ffffffffffffee58);
            pvVar3 = Kernel::AtomicFormula::operator_new(0xa64767);
            local_508 = local_3b0._content;
            local_510 = local_448[0]._content;
            Kernel::Literal::create2
                      ((uint)(in_stack_ffffffffffffecf0._content >> 0x20),
                       SUB81(in_stack_ffffffffffffecf0._content >> 0x18,0),in_stack_ffffffffffffed00
                       ,in_stack_ffffffffffffecf8);
            Kernel::AtomicFormula::AtomicFormula
                      ((AtomicFormula *)in_stack_ffffffffffffece0,
                       (Literal *)in_stack_ffffffffffffecd8._content);
            local_500 = pvVar3;
            ParseResult::ParseResult
                      ((ParseResult *)in_stack_ffffffffffffece0,
                       (Formula *)in_stack_ffffffffffffecd8._content);
            Lib::Stack<Parse::SMTLIB2::ParseResult>::push
                      ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
                       (ParseResult *)in_stack_ffffffffffffece8._content);
            ParseResult::~ParseResult((ParseResult *)0xa64838);
          }
          else {
            local_558 = local_3e0;
            local_550 = Kernel::Theory::getArrayOperatorType(in_stack_ffffffffffffed78,i);
            local_55c = Kernel::Signature::getInterpretingSymbol
                                  ((Signature *)
                                   CONCAT17(in_stack_ffffffffffffee6f,in_stack_ffffffffffffee68),
                                   interp,in_stack_ffffffffffffee58);
            local_570 = local_3b0._content;
            local_578 = local_448[0]._content;
            Kernel::Term::create2
                      ((uint)(in_stack_ffffffffffffecf0._content >> 0x20),in_stack_ffffffffffffed00,
                       in_stack_ffffffffffffecf8);
            Kernel::TermList::TermList
                      ((TermList *)in_stack_ffffffffffffece0,
                       (Term *)in_stack_ffffffffffffecd8._content);
            local_5c0 = local_3e0;
            local_5b8 = (uint64_t)Kernel::SortHelper::getInnerSort(in_stack_ffffffffffffecd8);
            local_5c8 = local_568;
            ParseResult::ParseResult
                      ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
                       in_stack_ffffffffffffece8);
            Lib::Stack<Parse::SMTLIB2::ParseResult>::push
                      ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
                       (ParseResult *)in_stack_ffffffffffffece8._content);
            ParseResult::~ParseResult((ParseResult *)0xa649c5);
          }
          return true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed20,
                   (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                    CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                   (allocator<char> *)in_stack_ffffffffffffed10._content);
        complainAboutArgShortageOrWrongSorts
                  (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffed20,
               (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
               (allocator<char> *)in_stack_ffffffffffffed10._content);
    complainAboutArgShortageOrWrongSorts
              (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
  case TS_STORE:
    Kernel::TermList::TermList(&local_5d0);
    bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
    if (!bVar1) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                  ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
        local_600 = (uint64_t)
                    ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                        (TermList *)in_stack_ffffffffffffece0);
        ParseResult::~ParseResult((ParseResult *)0xa64b4f);
        bVar1 = Kernel::TermList::isArraySort((TermList *)in_stack_ffffffffffffece0);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed20,
                     (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                      CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18))
                     ,(allocator<char> *)in_stack_ffffffffffffed10._content);
          complainAboutArgShortageOrWrongSorts
                    (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
        }
        Kernel::TermList::TermList(local_668);
        bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                          ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
        local_6a9 = 0;
        local_1099 = true;
        if (!bVar1) {
          Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                    ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
          bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
          local_1099 = true;
          if (!bVar1) {
            Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                      ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
            local_6a9 = 1;
            local_670 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                            (TermList *)in_stack_ffffffffffffece0);
            local_6c0 = local_600;
            local_6b8 = Kernel::SortHelper::getIndexSort(in_stack_ffffffffffffecd8);
            local_1099 = Kernel::TermList::operator!=(&local_670,&local_6b8);
          }
        }
        if ((local_6a9 & 1) != 0) {
          ParseResult::~ParseResult((ParseResult *)0xa64d89);
        }
        if (local_1099 == false) {
          Kernel::TermList::TermList(local_6f0);
          bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                            ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
          local_731 = 0;
          local_10d1 = true;
          if (!bVar1) {
            Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
            bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
            local_10d1 = true;
            if (!bVar1) {
              Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                        ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
              local_731 = 1;
              local_6f8 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                              (TermList *)in_stack_ffffffffffffece0);
              local_748 = local_600;
              local_740 = Kernel::SortHelper::getInnerSort(in_stack_ffffffffffffecd8);
              local_10d1 = Kernel::TermList::operator!=(&local_6f8,&local_740);
            }
          }
          if ((local_731 & 1) != 0) {
            ParseResult::~ParseResult((ParseResult *)0xa64fca);
          }
          if (local_10d1 == false) {
            local_780 = local_600;
            local_778 = Kernel::Theory::getArrayOperatorType(in_stack_ffffffffffffed78,i);
            local_784 = Kernel::Signature::getInterpretingSymbol
                                  ((Signature *)
                                   CONCAT17(in_stack_ffffffffffffee6f,in_stack_ffffffffffffee68),
                                   interp,in_stack_ffffffffffffee58);
            local_7a8 = local_5d0._content;
            local_7a0 = local_668[0]._content;
            local_798 = local_6f0[0]._content;
            Kernel::Term::create
                      (in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98,in_stack_ffffffffffffed90
                      );
            Kernel::TermList::TermList
                      ((TermList *)in_stack_ffffffffffffece0,
                       (Term *)in_stack_ffffffffffffecd8._content);
            local_7f0 = local_600;
            local_7f8 = local_7b0;
            ParseResult::ParseResult
                      ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
                       in_stack_ffffffffffffece8);
            Lib::Stack<Parse::SMTLIB2::ParseResult>::push
                      ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
                       (ParseResult *)in_stack_ffffffffffffece8._content);
            ParseResult::~ParseResult((ParseResult *)0xa651e6);
            return true;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed20,
                     (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                      CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18))
                     ,(allocator<char> *)in_stack_ffffffffffffed10._content);
          complainAboutArgShortageOrWrongSorts
                    (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed20,
                   (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                    CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                   (allocator<char> *)in_stack_ffffffffffffed10._content);
        complainAboutArgShortageOrWrongSorts
                  (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffed20,
               (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
               (allocator<char> *)in_stack_ffffffffffffed10._content);
    complainAboutArgShortageOrWrongSorts
              (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
  case TS_TO_INT:
    Kernel::TermList::TermList(&local_2d8);
    bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
    local_319 = 0;
    local_f79 = true;
    if (!bVar1) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
      local_f79 = true;
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                  ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
        local_319 = 1;
        local_2e0 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                        (TermList *)in_stack_ffffffffffffece0);
        local_328 = Kernel::AtomicSort::realSort();
        local_f79 = Kernel::TermList::operator!=(&local_2e0,&local_328);
      }
    }
    if ((local_319 & 1) != 0) {
      ParseResult::~ParseResult((ParseResult *)0xa6404e);
    }
    if (local_f79 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed20,
                 (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                  CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                 (allocator<char> *)in_stack_ffffffffffffed10._content);
      complainAboutArgShortageOrWrongSorts
                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
    }
    local_350 = Kernel::Signature::getInterpretingSymbol
                          (in_stack_ffffffffffffece0,
                           (Interpretation)(in_stack_ffffffffffffecd8._content >> 0x20));
    local_360 = local_2d8._content;
    Kernel::Term::create1
              ((uint)(in_stack_ffffffffffffece8._content >> 0x20),in_stack_ffffffffffffecf0);
    Kernel::TermList::TermList
              ((TermList *)in_stack_ffffffffffffece0,(Term *)in_stack_ffffffffffffecd8._content);
    local_3a0 = (uint64_t)Kernel::AtomicSort::intSort();
    local_3a8 = local_358;
    ParseResult::ParseResult
              ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
               in_stack_ffffffffffffece8);
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push
              ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
               (ParseResult *)in_stack_ffffffffffffece8._content);
    ParseResult::~ParseResult((ParseResult *)0xa64207);
    local_1 = true;
    break;
  case TS_TO_REAL:
    Kernel::TermList::TermList(&local_200);
    bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                      ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
    local_241 = 0;
    local_f31 = true;
    if (!bVar1) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      bVar1 = ParseResult::isSeparator((ParseResult *)in_stack_ffffffffffffece0);
      local_f31 = true;
      if (!bVar1) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                  ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf8._content);
        local_241 = 1;
        local_208 = ParseResult::asTerm(in_stack_ffffffffffffece8._content,
                                        (TermList *)in_stack_ffffffffffffece0);
        local_250 = Kernel::AtomicSort::intSort();
        local_f31 = Kernel::TermList::operator!=(&local_208,&local_250);
      }
    }
    if ((local_241 & 1) != 0) {
      ParseResult::~ParseResult((ParseResult *)0xa63d26);
    }
    if (local_f31 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed20,
                 (char *)CONCAT17(in_stack_ffffffffffffed1f,
                                  CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                 (allocator<char> *)in_stack_ffffffffffffed10._content);
      complainAboutArgShortageOrWrongSorts
                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
    }
    local_278 = Kernel::Signature::getInterpretingSymbol
                          (in_stack_ffffffffffffece0,
                           (Interpretation)(in_stack_ffffffffffffecd8._content >> 0x20));
    local_288 = local_200._content;
    Kernel::Term::create1
              ((uint)(in_stack_ffffffffffffece8._content >> 0x20),in_stack_ffffffffffffecf0);
    Kernel::TermList::TermList
              ((TermList *)in_stack_ffffffffffffece0,(Term *)in_stack_ffffffffffffecd8._content);
    local_2c8 = (uint64_t)Kernel::AtomicSort::realSort();
    local_2d0 = local_280;
    ParseResult::ParseResult
              ((ParseResult *)in_stack_ffffffffffffece0,in_stack_ffffffffffffecf0,
               in_stack_ffffffffffffece8);
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push
              ((Stack<Parse::SMTLIB2::ParseResult> *)in_stack_ffffffffffffecf0._content,
               (ParseResult *)in_stack_ffffffffffffece8._content);
    ParseResult::~ParseResult((ParseResult *)0xa63edf);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SMTLIB2::parseAsBuiltinTermSymbol(const std::string& id, LExpr* exp)
{
  // try built-in term symbols
  TermSymbol ts = getBuiltInTermSymbol(id);
  switch(ts) {
    case TS_ITE:
    {
      Formula* cond;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          !(_results.pop().asFormula(cond))) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList thenBranch;
      if (_results.isEmpty() || _results.top().isSeparator()){
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList sort = _results.pop().asTerm(thenBranch);
      TermList elseBranch;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(elseBranch) != sort){
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList res = TermList(Term::createITE(cond, thenBranch, elseBranch, sort));

      _results.push(ParseResult(sort,res));
      return true;
    }
    case TS_TO_REAL:
    {
      TermList theInt;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theInt) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_TO_REAL);
      TermList res = TermList(Term::create1(fun,theInt));

      _results.push(ParseResult(AtomicSort::realSort(),res));
      return true;
    }
    case TS_TO_INT:
    {
      TermList theReal;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theReal) != AtomicSort::realSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::REAL_TO_INT);
      TermList res = TermList(Term::create1(fun,theReal));

      _results.push(ParseResult(AtomicSort::intSort(),res));
      return true;
    }
    case TS_SELECT:
    {
      TermList theArray;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList arraySortIdx = _results.pop().asTerm(theArray);
      if (!arraySortIdx.isArraySort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theIndex;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theIndex) != SortHelper::getIndexSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      if (SortHelper::getInnerSort(arraySortIdx)== AtomicSort::boolSort()) {
        OperatorType* predType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_BOOL_SELECT);
        unsigned pred = env.signature->getInterpretingSymbol(Theory::ARRAY_BOOL_SELECT,predType);

        Formula* res = new AtomicFormula(Literal::create2(pred,true,theArray,theIndex));

        _results.push(ParseResult(res));
      } else {
        OperatorType* funType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_SELECT);
        unsigned fun = env.signature->getInterpretingSymbol(Theory::ARRAY_SELECT,funType);

        TermList res = TermList(Term::create2(fun,theArray,theIndex));

        _results.push(ParseResult(SortHelper::getInnerSort(arraySortIdx),res));
      }

      return true;
    }
    case TS_STORE:
    {
      TermList theArray;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList arraySortIdx = _results.pop().asTerm(theArray);
      if (!arraySortIdx.isArraySort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theIndex;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theIndex) != SortHelper::getIndexSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theValue;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theValue) != SortHelper::getInnerSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      OperatorType* funType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_STORE);
      unsigned fun = env.signature->getInterpretingSymbol(Theory::ARRAY_STORE,funType);

      TermList args[] = {theArray, theIndex, theValue};
      TermList res = TermList(Term::create(fun, 3, args));

      _results.push(ParseResult(arraySortIdx,res));

      return true;
    }
    case TS_ABS:
    {
      TermList theInt;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theInt) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_ABS);
      TermList res = TermList(Term::create1(fun,theInt));

      _results.push(ParseResult(AtomicSort::intSort(),res));

      return true;
    }
    case TS_MOD:
    {
      TermList int1, int2;
      if (_results.isEmpty() || _results.top().isSeparator() || _results.pop().asTerm(int1) != AtomicSort::intSort() ||
          _results.isEmpty() || _results.top().isSeparator() || _results.pop().asTerm(int2) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_REMAINDER_E); // TS_MOD is the always positive remainder, therefore INT_REMAINDER_E
      TermList res = TermList(Term::create2(fun,int1,int2));

      _results.push(ParseResult(AtomicSort::intSort(),res));

      return true;
    }
    case TS_MULTIPLY:
    case TS_PLUS:
    case TS_MINUS:
    case TS_DIVIDE:
    case TS_DIV:
    {
      // read the first argument
      TermList first;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList sort = _results.pop().asTerm(first);

      if (_results.isEmpty() || _results.top().isSeparator()) {
        if (ts == TS_MINUS) { // unary minus
          Interpretation intp = getUnaryMinusInterpretation(sort);
          unsigned fun = env.signature->getInterpretingSymbol(intp);

          TermList res = TermList(Term::create1(fun,first));

          _results.push(ParseResult(sort,res));

          return true;
        } else {
          complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp); // we need at least two arguments otherwise
        }
      }

      Interpretation intp = getTermSymbolInterpretation(ts,sort);
      unsigned fun = env.signature->getInterpretingSymbol(intp);

      TermList second;
      if (_results.pop().asTerm(second) != sort) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList res = TermList(Term::create2(fun,first,second));
      while (_results.isNonEmpty() && !_results.top().isSeparator()) {
        TermList another;
        if (_results.pop().asTerm(another) != sort) {
          complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
        }

        res = TermList(Term::create2(fun,res,another));
      }
      _results.push(ParseResult(sort,res));

      return true;
    }
    case TS_ARRAY:
    {
      TermList indexSort;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      ALWAYS(_results.pop().asTerm(indexSort) == AtomicSort::superSort());
      TermList innerSort;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      ALWAYS(_results.pop().asTerm(innerSort) == AtomicSort::superSort());
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::arraySort(indexSort, innerSort)));
      return true;
    }
    case TS_BOOL:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::boolSort()));
      return true;
    }
    case TS_INT:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::intSort()));
      return true;
    }
    case TS_REAL:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::realSort()));
      return true;
    }
    default:
      ASS_EQ(ts,TS_USER_FUNCTION);
      return false;
  }
}